

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgensubstruct.cpp
# Opt level: O2

void __thiscall
TPZGenSubStruct::IdentifyEqNumbers
          (TPZGenSubStruct *this,TPZSubCompMesh *sub,TPZVec<int> *global,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *globinv)

{
  int iVar1;
  uint uVar2;
  TNode *pTVar3;
  int64_t iVar4;
  TPZConnect *pTVar5;
  mapped_type_conflict4 *pmVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  int local_6c;
  TPZCompMesh *local_68;
  TPZSubCompMesh *local_60;
  ulong local_58;
  TPZChunkVector<TPZConnect,_10> *local_50;
  TPZChunkVector<TPZConnect,_10> *local_48;
  ulong local_40;
  undefined4 local_34;
  
  local_50 = &(sub->super_TPZCompMesh).fConnectVec.super_TPZChunkVector<TPZConnect,_10>;
  uVar2 = (uint)(sub->super_TPZCompMesh).fConnectVec.super_TPZChunkVector<TPZConnect,_10>.fNElements
  ;
  local_60 = sub;
  TPZCompMesh::NEquations(&sub->super_TPZCompMesh);
  local_34 = 0xffffffff;
  (*global->_vptr_TPZVec[2])(global);
  local_68 = ((this->fCMesh).fRef)->fPointer;
  local_48 = &(local_68->fConnectVec).super_TPZChunkVector<TPZConnect,_10>;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  local_40 = (ulong)uVar2;
  for (local_58 = 0; local_58 != local_40; local_58 = local_58 + 1) {
    iVar4 = TPZSubCompMesh::NodeIndex(local_60,local_58,local_68);
    if ((int)iVar4 != -1) {
      pTVar5 = TPZChunkVector<TPZConnect,_10>::operator[](local_50,local_58);
      iVar1 = (int)pTVar5->fSequenceNumber;
      pTVar5 = TPZChunkVector<TPZConnect,_10>::operator[](local_48,(long)(int)iVar4);
      pTVar3 = (local_60->super_TPZCompMesh).fBlock.fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
      lVar9 = (long)pTVar3[iVar1].pos;
      iVar7 = (local_68->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore
              [(int)pTVar5->fSequenceNumber].pos;
      uVar2 = pTVar3[iVar1].dim;
      uVar8 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar8 = 0;
      }
      while (bVar10 = uVar8 != 0, uVar8 = uVar8 - 1, bVar10) {
        global->fStore[lVar9] = iVar7;
        local_6c = iVar7;
        pmVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](globinv,&local_6c);
        *pmVar6 = (mapped_type_conflict4)lVar9;
        iVar7 = iVar7 + 1;
        lVar9 = lVar9 + 1;
      }
    }
  }
  return;
}

Assistant:

void TPZGenSubStruct::IdentifyEqNumbers(TPZSubCompMesh *sub, TPZVec<int> &global, std::map<int,int> &globinv)
{
	int ncon = sub->ConnectVec().NElements();
	// ncon is the number of connects of the subcompmesh
	TPZCompMesh *subcomp = (TPZCompMesh *) sub;
	global.Resize(subcomp->NEquations(),-1);
	TPZCompMesh *super = fCMesh.operator->();
	int ic;
#ifdef PZ_LOG_STOP
	std::stringstream sout;
	sout << "total submesh connects/glob/loc ";
#endif
	for(ic=0; ic<ncon; ic++)
	{
		int glob = sub->NodeIndex(ic,super);
		// continue is the connect is internal
		if(glob == -1) continue;
		int locseq = sub->ConnectVec()[ic].SequenceNumber();
		int globseq = super->ConnectVec()[glob].SequenceNumber();
		int locpos = sub->Block().Position(locseq);
		int globpos = super->Block().Position(globseq);
		int locsize = sub->Block().Size(locseq);
		//    int globsize = super->Block().Size(globseq);
		int ieq;
		for(ieq =0; ieq<locsize; ieq++)
		{
#ifdef PZ_LOG_STOP
			sout << ic << "/" << globpos+ieq << "/" << locpos+ieq << " ";
#endif
			global[locpos+ieq] = globpos+ieq;
			globinv[globpos+ieq] = locpos+ieq;
		}
	}
#ifdef PZ_LOG_STOP
	LOGPZ_DEBUG(logger,sout.str())
#endif
}